

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast0x10000049.Transform6D.0_1_2_3_4_5.cpp
# Opt level: O3

void IKSolver::polyroots3(IkReal *rawcoeffs,IkReal *rawroots,int *numroots)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int i;
  long lVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  double *pdVar9;
  double *pdVar10;
  ulong uVar11;
  int j;
  long lVar12;
  bool bVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  bool visited [3];
  complex<double> roots [3];
  complex<double> coeffs [3];
  undefined1 local_108 [8];
  undefined8 uStack_100;
  undefined1 local_f8 [24];
  IkReal *local_e0;
  int *local_d8;
  ulong local_d0;
  double local_c8 [4];
  double local_a8 [2];
  complex<double> local_98;
  double local_88;
  undefined8 uStack_80;
  double local_78 [7];
  double dStack_40;
  
  dVar1 = *rawcoeffs;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    local_78[4] = 0.0;
    local_78[5] = 0.0;
    local_78[2] = 0.0;
    local_78[3] = 0.0;
    local_78[0] = 0.0;
    local_78[1] = 0.0;
    lVar4 = 0;
    do {
      *(double *)((long)local_78 + lVar4 * 2) = *(double *)((long)rawcoeffs + lVar4 + 8) / dVar1;
      *(undefined8 *)((long)local_78 + lVar4 * 2 + 8) = 0;
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x18);
    local_88 = 0.0;
    uStack_80 = 0;
    local_a8[0] = 1.0;
    local_a8[1] = 0.0;
    local_98._M_value._0_8_ = 0x3fd999999999999a;
    local_98._M_value._8_8_ = 0x3feccccccccccccd;
    local_c8[0] = 1.0;
    local_c8[1] = 1.0;
    local_108 = (undefined1  [8])0x3fd999999999999a;
    uStack_100 = 0.9;
    local_e0 = rawroots;
    local_d8 = numroots;
    std::complex<double>::operator*=((complex<double> *)local_108,&local_98);
    local_88 = (double)local_108;
    uStack_80 = uStack_100;
    local_c8[2] = 1.0;
    local_78[6] = local_78[0];
    dStack_40 = local_78[1];
    local_d0 = 0;
LAB_00160f73:
    do {
      bVar13 = true;
      lVar4 = 0;
      do {
        pdVar9 = local_a8 + lVar4 * 2;
        lVar12 = lVar4;
        while (local_c8[lVar12] < 2.842170943040401e-14) {
          lVar12 = lVar12 + 1;
          pdVar9 = pdVar9 + 2;
          if (lVar12 == 3) {
            uVar7 = (int)local_d0 + 1;
            local_d0 = (ulong)uVar7;
            if (!bVar13 && uVar7 != 0x6e) goto LAB_00160f73;
            goto LAB_001610b3;
          }
        }
        local_f8._8_4_ = SUB84(pdVar9[1] + dStack_40,0);
        local_f8._0_8_ = *pdVar9 + local_78[6];
        local_f8._12_4_ = (int)((ulong)(pdVar9[1] + dStack_40) >> 0x20);
        lVar4 = 0;
        do {
          local_108 = (undefined1  [8])*pdVar9;
          uStack_100 = pdVar9[1];
          std::complex<double>::operator*=((complex<double> *)local_108,(complex<double> *)local_f8)
          ;
          dVar1 = (double)local_108 + *(double *)((long)local_78 + lVar4 + 0x10);
          dVar14 = uStack_100 + *(double *)((long)local_78 + lVar4 + 0x18);
          local_f8._8_4_ = SUB84(dVar14,0);
          local_f8._0_8_ = dVar1;
          local_f8._12_4_ = (int)((ulong)dVar14 >> 0x20);
          lVar4 = lVar4 + 0x10;
        } while (lVar4 != 0x20);
        pdVar10 = local_a8 + 1;
        lVar4 = 0;
        do {
          if (lVar12 != lVar4) {
            dVar15 = *pdVar9;
            dVar16 = pdVar9[1];
            dVar2 = pdVar10[-1];
            dVar3 = *pdVar10;
            if ((dVar15 == dVar2) && (!NAN(dVar15) && !NAN(dVar2))) {
              if ((dVar16 == dVar3) && (!NAN(dVar16) && !NAN(dVar3))) goto LAB_00161047;
            }
            dVar1 = (double)__divdc3(SUB84(dVar1,0),dVar14,dVar15 - dVar2,dVar16 - dVar3);
            local_f8._8_8_ = dVar14;
            local_f8._0_8_ = dVar1;
          }
LAB_00161047:
          lVar4 = lVar4 + 1;
          pdVar10 = pdVar10 + 2;
        } while (lVar4 != 3);
        *pdVar9 = *pdVar9 - dVar1;
        pdVar9[1] = pdVar9[1] - dVar14;
        dVar1 = cabs(dVar1);
        local_c8[lVar12] = dVar1;
        lVar4 = lVar12 + 1;
        bVar13 = false;
      } while (lVar12 != 2);
      uVar7 = (int)local_d0 + 1;
      local_d0 = (ulong)uVar7;
    } while (uVar7 != 0x6e);
LAB_001610b3:
    *local_d8 = 0;
    local_108 = (undefined1  [8])((ulong)local_108 & 0xffffffffff000000);
    uVar5 = 0;
    iVar6 = 0;
    do {
      if (local_108[uVar5] == '\0') {
        dVar1 = local_a8[uVar5 * 2];
        dVar14 = local_a8[uVar5 * 2 + 1];
        iVar8 = 1;
        uVar11 = uVar5;
        dVar15 = dVar1;
        dVar16 = dVar14;
        if (uVar5 < 2) {
          do {
            if ((ABS(dVar1 - local_a8[(uVar11 + 1) * 2]) < 1.4901161193847656e-08) &&
               (ABS(dVar14 - local_a8[(uVar11 + 1) * 2 + 1]) < 0.002)) {
              dVar15 = dVar15 + local_a8[(uVar11 + 1) * 2];
              dVar16 = dVar16 + local_a8[(uVar11 + 1) * 2 + 1];
              iVar8 = iVar8 + 1;
              local_108[uVar11 + 1] = 1;
            }
            bVar13 = uVar11 == 0;
            uVar11 = 1;
          } while (bVar13);
        }
        if (1 < iVar8) {
          dVar16 = dVar16 / (double)iVar8;
        }
        if (ABS(dVar16) < 1.4901161193847656e-08) {
          if (1 < iVar8) {
            dVar15 = dVar15 / (double)iVar8;
          }
          lVar4 = (long)iVar6;
          iVar6 = iVar6 + 1;
          *local_d8 = iVar6;
          local_e0[lVar4] = dVar15;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != 3);
  }
  else {
    dVar1 = rawcoeffs[2];
    dVar14 = dVar1 * dVar1 + rawcoeffs[1] * -4.0 * rawcoeffs[3];
    iVar6 = 0;
    if (0.0 <= dVar14) {
      if ((dVar14 != 0.0) || (NAN(dVar14))) {
        if (dVar14 < 0.0) {
          dVar14 = sqrt(dVar14);
        }
        else {
          dVar14 = SQRT(dVar14);
        }
        *rawroots = (dVar14 - rawcoeffs[2]) / (rawcoeffs[1] + rawcoeffs[1]);
        rawroots[1] = (-rawcoeffs[2] - dVar14) / (rawcoeffs[1] + rawcoeffs[1]);
        iVar6 = 2;
      }
      else {
        *rawroots = (dVar1 * -0.5) / rawcoeffs[1];
        iVar6 = 1;
      }
    }
    *numroots = iVar6;
  }
  return;
}

Assistant:

static inline void polyroots3(IkReal rawcoeffs[3+1], IkReal rawroots[3], int& numroots)
{
    using std::complex;
    if( rawcoeffs[0] == 0 ) {
        // solve with one reduced degree
        polyroots2(&rawcoeffs[1], &rawroots[0], numroots);
        return;
    }
    IKFAST_ASSERT(rawcoeffs[0] != 0);
    const IkReal tol = 128.0*std::numeric_limits<IkReal>::epsilon();
    const IkReal tolsqrt = sqrt(std::numeric_limits<IkReal>::epsilon());
    complex<IkReal> coeffs[3];
    const int maxsteps = 110;
    for(int i = 0; i < 3; ++i) {
        coeffs[i] = complex<IkReal>(rawcoeffs[i+1]/rawcoeffs[0]);
    }
    complex<IkReal> roots[3];
    IkReal err[3];
    roots[0] = complex<IkReal>(1,0);
    roots[1] = complex<IkReal>(0.4,0.9); // any complex number not a root of unity works
    err[0] = 1.0;
    err[1] = 1.0;
    for(int i = 2; i < 3; ++i) {
        roots[i] = roots[i-1]*roots[1];
        err[i] = 1.0;
    }
    for(int step = 0; step < maxsteps; ++step) {
        bool changed = false;
        for(int i = 0; i < 3; ++i) {
            if ( err[i] >= tol ) {
                changed = true;
                // evaluate
                complex<IkReal> x = roots[i] + coeffs[0];
                for(int j = 1; j < 3; ++j) {
                    x = roots[i] * x + coeffs[j];
                }
                for(int j = 0; j < 3; ++j) {
                    if( i != j ) {
                        if( roots[i] != roots[j] ) {
                            x /= (roots[i] - roots[j]);
                        }
                    }
                }
                roots[i] -= x;
                err[i] = abs(x);
            }
        }
        if( !changed ) {
            break;
        }
    }

    numroots = 0;
    bool visited[3] = {false};
    for(int i = 0; i < 3; ++i) {
        if( !visited[i] ) {
            // might be a multiple root, in which case it will have more error than the other roots
            // find any neighboring roots, and take the average
            complex<IkReal> newroot=roots[i];
            int n = 1;
            for(int j = i+1; j < 3; ++j) {
                // care about error in real much more than imaginary
                if( abs(real(roots[i])-real(roots[j])) < tolsqrt && abs(imag(roots[i])-imag(roots[j])) < 0.002 ) {
                    newroot += roots[j];
                    n += 1;
                    visited[j] = true;
                }
            }
            if( n > 1 ) {
                newroot /= n;
            }
            // there are still cases where even the mean is not accurate enough, until a better multi-root algorithm is used, need to use the sqrt
            if( IKabs(imag(newroot)) < tolsqrt ) {
                rawroots[numroots++] = real(newroot);
            }
        }
    }
}